

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.h
# Opt level: O2

S2Point * __thiscall
s2coding::EncodedS2PointVector::operator[]
          (S2Point *__return_storage_ptr__,EncodedS2PointVector *this,int i)

{
  VType *pVVar1;
  char *pcVar2;
  VType VVar3;
  S2LogMessage SStack_18;
  
  if (this->format_ == CELL_IDS) {
    DecodeCellIdsFormat(__return_storage_ptr__,this,i);
  }
  else {
    if (this->format_ != UNCOMPRESSED) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.h"
                 ,0x85,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_18.stream_,"Unrecognized format");
      abort();
    }
    pcVar2 = (this->field_2).cell_ids_.blocks.offsets_.data_;
    __return_storage_ptr__->c_[2] = *(VType *)(pcVar2 + (long)i * 0x18 + 0x10);
    pVVar1 = (VType *)(pcVar2 + (long)i * 0x18);
    VVar3 = pVVar1[1];
    __return_storage_ptr__->c_[0] = *pVVar1;
    __return_storage_ptr__->c_[1] = VVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

inline S2Point EncodedS2PointVector::operator[](int i) const {
  switch (format_) {
    case Format::UNCOMPRESSED:
      return uncompressed_.points[i];

    case Format::CELL_IDS:
      return DecodeCellIdsFormat(i);

    default:
      S2_LOG(DFATAL) << "Unrecognized format";
      return S2Point();
  }
}